

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_zadd_patch_(DoubleComplex *alpha,Integer *g_a,Integer *ailo,Integer *aihi,Integer *ajlo,
                   Integer *ajhi,DoubleComplex *beta,Integer *g_b,Integer *bilo,Integer *bihi,
                   Integer *bjlo,Integer *bjhi,Integer *g_c,Integer *cilo,Integer *cihi,
                   Integer *cjlo,Integer *cjhi)

{
  Integer *in_RCX;
  Integer *in_RDX;
  void *unaff_RBX;
  Integer unaff_RBP;
  Integer *in_RSI;
  Integer in_RDI;
  Integer *in_R8;
  void *unaff_R15;
  Integer *unaff_retaddr;
  Integer *in_stack_00000008;
  Integer *in_stack_00000010;
  Integer *in_stack_00000018;
  Integer in_stack_00000020;
  Integer *in_stack_00000028;
  Integer *in_stack_00000030;
  Integer *in_stack_00000038;
  Integer *in_stack_00000040;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer in_stack_000000b8;
  char *in_stack_000000c0;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  
  pnga_inquire_type((Integer)g_c,bjhi);
  pnga_inquire_type((Integer)g_c,bjhi);
  pnga_inquire_type((Integer)g_c,bjhi);
  if (((local_68 != local_70) || (local_68 != local_78)) || (local_68 != 0x3ef)) {
    pnga_error(in_stack_000000c0,in_stack_000000b8);
  }
  sga_add_patch(unaff_RBX,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,unaff_R15,unaff_RBP,unaff_retaddr,
                in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040);
  return;
}

Assistant:

void FATR ga_zadd_patch_(DoubleComplex *alpha, Integer *g_a, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, DoubleComplex *beta, Integer *g_b, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, Integer *g_c, Integer *cilo, Integer *cihi, Integer *cjlo, Integer *cjhi)
{
    Integer atype, btype, ctype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    pnga_inquire_type(*g_c, &ctype);
    if (atype != btype || atype != ctype || atype != C_DCPL)
        pnga_error(" wrong types ", 0L);
    sga_add_patch(alpha, *g_a, ailo, aihi, ajlo, ajhi, beta, *g_b, bilo, bihi, bjlo, bjhi, *g_c, cilo, cihi, cjlo, cjhi);
}